

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O0

char * src_get_description(int converter_type)

{
  char *desc;
  char *pcStack_10;
  int converter_type_local;
  
  pcStack_10 = sinc_get_description(converter_type);
  if (((pcStack_10 == (char *)0x0) &&
      (pcStack_10 = zoh_get_description(converter_type), pcStack_10 == (char *)0x0)) &&
     (pcStack_10 = linear_get_description(converter_type), pcStack_10 == (char *)0x0)) {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char *
src_get_description (int converter_type)
{	const char *desc ;

	if ((desc = sinc_get_description (converter_type)) != NULL)
		return desc ;

	if ((desc = zoh_get_description (converter_type)) != NULL)
		return desc ;

	if ((desc = linear_get_description (converter_type)) != NULL)
		return desc ;

	return NULL ;
}